

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void QSslSocketPrivate::setDefaultCaCertificates(QList<QSslCertificate> *certs)

{
  __pointer_type pQVar1;
  QSslConfigurationPrivate *pQVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *pTVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *this;
  bool bVar6;
  
  pTVar5 = (Type *)certs;
  ensureInitialized();
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar5);
  if (pTVar3 != (Type *)0x0) {
    if ((pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar6 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar6) {
        (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar6) goto LAB_0016e82d;
    }
    pTVar5 = pTVar3;
    QBasicMutex::lockInternal();
  }
LAB_0016e82d:
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar5);
  pQVar2 = (pTVar4->config).d.ptr;
  if ((pQVar2 != (QSslConfigurationPrivate *)0x0) &&
     ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    pTVar5 = (Type *)&pTVar4->config;
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach_helper
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pTVar5);
  }
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar5);
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
         &((pTVar5->config).d.ptr)->caCertificates;
  QArrayDataPointer<QSslCertificate>::operator=
            ((QArrayDataPointer<QSslCertificate> *)this,&certs->d);
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(this);
  pQVar2 = (pTVar5->dtlsConfig).d.ptr;
  if ((pQVar2 != (QSslConfigurationPrivate *)0x0) &&
     ((__int_type)
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
           &pTVar5->dtlsConfig;
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach_helper
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)this);
  }
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(this);
  QArrayDataPointer<QSslCertificate>::operator=
            (&(((pTVar5->dtlsConfig).d.ptr)->caCertificates).d,&certs->d);
  s_loadRootCertsOnDemand = false;
  if (pTVar3 != (Type *)0x0) {
    LOCK();
    pQVar1 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pTVar3);
      return;
    }
  }
  return;
}

Assistant:

void QSslSocketPrivate::setDefaultCaCertificates(const QList<QSslCertificate> &certs)
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    globalData()->config.detach();
    globalData()->config->caCertificates = certs;
    globalData()->dtlsConfig.detach();
    globalData()->dtlsConfig->caCertificates = certs;
    // when the certificates are set explicitly, we do not want to
    // load the system certificates on demand
    s_loadRootCertsOnDemand = false;
}